

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglplatformcontext.cpp
# Opt level: O0

EGLSurface __thiscall
QEGLPlatformContext::createTemporaryOffscreenSurface(QEGLPlatformContext *this)

{
  long lVar1;
  EGLConfig pvVar2;
  EGLSurface pvVar3;
  QSurfaceFormat *in_RDI;
  long in_FS_OFFSET;
  EGLConfig config;
  EGLint pbufferAttributes [7];
  undefined8 in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar2 = q_configFromGLFormat
                     ((EGLDisplay)0x100003057,in_RDI,
                      SUB81((ulong)in_stack_ffffffffffffffc8 >> 0x38,0),
                      (int)in_stack_ffffffffffffffc8);
  pvVar3 = (EGLSurface)eglCreatePbufferSurface(in_RDI[5].d,pvVar2,&stack0xffffffffffffffd8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pvVar3;
  }
  __stack_chk_fail();
}

Assistant:

EGLSurface QEGLPlatformContext::createTemporaryOffscreenSurface()
{
    // Make the context current to ensure the GL version query works. This needs a surface too.
    const EGLint pbufferAttributes[] = {
        EGL_WIDTH, 1,
        EGL_HEIGHT, 1,
        EGL_LARGEST_PBUFFER, EGL_FALSE,
        EGL_NONE
    };

    // Cannot just pass m_eglConfig because it may not be suitable for pbuffers. Instead,
    // do what QEGLPbuffer would do: request a config with the same attributes but with
    // PBUFFER_BIT set.
    EGLConfig config = q_configFromGLFormat(m_eglDisplay, m_format, false, EGL_PBUFFER_BIT);

    return eglCreatePbufferSurface(m_eglDisplay, config, pbufferAttributes);
}